

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-filenames.c
# Opt level: O0

void CGTFS_Filenames(void)

{
  int iVar1;
  greatest_test_res local_14;
  greatest_test_res local_10;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("filenames_no_trailing_slash");
  if (iVar1 == 1) {
    res_2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_2 == GREATEST_TEST_RES_PASS) {
      res_2 = filenames_no_trailing_slash();
    }
    greatest_test_post(res_2);
  }
  iVar1 = greatest_test_pre("filenames_with_trailing_slash");
  if (iVar1 == 1) {
    local_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_10 == GREATEST_TEST_RES_PASS) {
      local_10 = filenames_with_trailing_slash();
    }
    greatest_test_post(local_10);
  }
  iVar1 = greatest_test_pre("filenames_passed_null");
  if (iVar1 == 1) {
    local_14 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_14 == GREATEST_TEST_RES_PASS) {
      local_14 = filenames_passed_null();
    }
    greatest_test_post(local_14);
  }
  return;
}

Assistant:

SUITE(CGTFS_Filenames) {
    RUN_TEST(filenames_no_trailing_slash);
    RUN_TEST(filenames_with_trailing_slash);
    RUN_TEST(filenames_passed_null);
}